

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

TestCaseGroup * vkt::SpirVAssembly::anon_unknown_5::createOpPhiGroup(TestContext *testCtx)

{
  allocator<float> *paVar1;
  float fVar2;
  deUint32 seed;
  TestCaseGroup *pTVar3;
  TestNode *pTVar4;
  char *pcVar5;
  reference pvVar6;
  ulong uVar7;
  Buffer<float> *pBVar8;
  SpvAsmComputeShaderCase *pSVar9;
  pointer local_774;
  int local_76c;
  SharedPtr<vkt::SpirVAssembly::BufferInterface> local_768;
  SharedPtr<vkt::SpirVAssembly::BufferInterface> local_758;
  allocator<char> local_741;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  allocator<char> local_719;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  allocator<char> local_6f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  allocator<char> local_6c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  pointer local_604;
  int local_5fc;
  SharedPtr<vkt::SpirVAssembly::BufferInterface> local_5f8;
  SharedPtr<vkt::SpirVAssembly::BufferInterface> local_5e8;
  allocator<char> local_5d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  allocator<char> local_5a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  allocator<char> local_581;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  allocator<char> local_559;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  pointer local_494;
  int local_48c;
  SharedPtr<vkt::SpirVAssembly::BufferInterface> local_488;
  SharedPtr<vkt::SpirVAssembly::BufferInterface> local_478;
  allocator<char> local_461;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  allocator<char> local_439;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  allocator<char> local_411;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  allocator<char> local_3e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  ulong local_328;
  size_t ndx;
  undefined1 local_318 [8];
  vector<float,_std::allocator<float>_> outputFloats3;
  undefined1 local_2f8 [8];
  vector<float,_std::allocator<float>_> outputFloats2;
  undefined1 local_2d8 [8];
  vector<float,_std::allocator<float>_> outputFloats1;
  undefined1 local_2b8 [8];
  vector<float,_std::allocator<float>_> inputFloats;
  undefined1 local_298 [4];
  int numElements;
  Random rnd;
  ComputeShaderSpec spec3;
  ComputeShaderSpec spec2;
  ComputeShaderSpec spec1;
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  TestContext *testCtx_local;
  
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_ =
       testCtx;
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar3,(TestContext *)
                    group.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"opphi","Test the OpPhi instruction");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&spec1.verifyIO + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar3
            );
  ComputeShaderSpec::ComputeShaderSpec((ComputeShaderSpec *)&spec2.verifyIO);
  ComputeShaderSpec::ComputeShaderSpec((ComputeShaderSpec *)&spec3.verifyIO);
  ComputeShaderSpec::ComputeShaderSpec((ComputeShaderSpec *)&rnd.m_rnd.z);
  pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pcVar5 = tcu::TestNode::getName(pTVar4);
  seed = deStringHash(pcVar5);
  de::Random::Random((Random *)local_298,seed);
  inputFloats.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 100;
  outputFloats1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  paVar1 = (allocator<float> *)
           ((long)&outputFloats1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<float>::allocator(paVar1);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_2b8,100,
             (value_type_conflict3 *)
             ((long)&outputFloats1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&outputFloats1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  outputFloats2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  paVar1 = (allocator<float> *)
           ((long)&outputFloats2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<float>::allocator(paVar1);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_2d8,100,
             (value_type_conflict3 *)
             ((long)&outputFloats2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&outputFloats2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  outputFloats3.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  paVar1 = (allocator<float> *)
           ((long)&outputFloats3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<float>::allocator(paVar1);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_2f8,100,
             (value_type_conflict3 *)
             ((long)&outputFloats3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&outputFloats3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  ndx._4_4_ = 0;
  std::allocator<float>::allocator((allocator<float> *)((long)&ndx + 3));
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_318,100,
             (value_type_conflict3 *)((long)&ndx + 4),(allocator<float> *)((long)&ndx + 3));
  std::allocator<float>::~allocator((allocator<float> *)((long)&ndx + 3));
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_2b8,0);
  fillRandomScalars<float>((Random *)local_298,-300.0,300.0,pvVar6,100,0);
  floorAll((vector<float,_std::allocator<float>_> *)local_2b8);
  for (local_328 = 0; local_328 < 100; local_328 = local_328 + 1) {
    uVar7 = local_328 % 3;
    if (uVar7 == 0) {
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_2b8,local_328);
      fVar2 = *pvVar6;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_2d8,local_328);
      *pvVar6 = fVar2 + 5.5;
    }
    else if (uVar7 == 1) {
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_2b8,local_328);
      fVar2 = *pvVar6;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_2d8,local_328);
      *pvVar6 = fVar2 + 20.5;
    }
    else if (uVar7 == 2) {
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_2b8,local_328);
      fVar2 = *pvVar6;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_2d8,local_328);
      *pvVar6 = fVar2 + 1.75;
    }
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_2b8,local_328);
    fVar2 = *pvVar6;
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_2f8,local_328);
    *pvVar6 = fVar2 + 19.5;
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_2b8,local_328);
    fVar2 = *pvVar6;
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_318,local_328);
    *pvVar6 = 8.5 - fVar2;
  }
  pcVar5 = getComputeAsmShaderPreamble();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,pcVar5,&local_3e9);
  std::operator+(&local_3c8,&local_3e8,
                 "OpSource GLSL 430\nOpName %main \"main\"\nOpName %id \"gl_GlobalInvocationID\"\nOpDecorate %id BuiltIn GlobalInvocationId\n"
                );
  pcVar5 = getComputeAsmInputOutputBufferTraits();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,pcVar5,&local_411);
  std::operator+(&local_3a8,&local_3c8,&local_410);
  pcVar5 = getComputeAsmCommonTypes();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,pcVar5,&local_439);
  std::operator+(&local_388,&local_3a8,&local_438);
  pcVar5 = getComputeAsmInputOutputBuffer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,pcVar5,&local_461);
  std::operator+(&local_368,&local_388,&local_460);
  std::operator+(&local_348,&local_368,
                 "%id = OpVariable %uvec3ptr Input\n%zero       = OpConstant %i32 0\n%three      = OpConstant %u32 3\n%constf5p5  = OpConstant %f32 5.5\n%constf20p5 = OpConstant %f32 20.5\n%constf1p75 = OpConstant %f32 1.75\n%constf8p5  = OpConstant %f32 8.5\n%constf6p5  = OpConstant %f32 6.5\n%main     = OpFunction %void None %voidf\n%entry    = OpLabel\n%idval    = OpLoad %uvec3 %id\n%x        = OpCompositeExtract %u32 %idval 0\n%selector = OpUMod %u32 %x %three\n            OpSelectionMerge %phi None\n            OpSwitch %selector %default 0 %case0 1 %case1 2 %case2\n%case1    = OpLabel\n            OpBranch %phi\n%default  = OpLabel\n            OpUnreachable\n%phi      = OpLabel\n%operand  = OpPhi %f32   %constf1p75 %case2   %constf20p5 %case1   %constf5p5 %case0\n%inloc    = OpAccessChain %f32ptr %indata %zero %x\n%inval    = OpLoad %f32 %inloc\n%add      = OpFAdd %f32 %inval %operand\n%outloc   = OpAccessChain %f32ptr %outdata %zero %x\n            OpStore %outloc %add\n            OpReturn\n%case0    = OpLabel\n            OpBranch %phi\n%case2    = OpLabel\n            OpBranch %phi\n            OpFunctionEnd\n"
                );
  std::__cxx11::string::operator=((string *)&spec2.verifyIO,(string *)&local_348);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator(&local_461);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator(&local_439);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator(&local_411);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  pBVar8 = (Buffer<float> *)operator_new(0x20);
  Buffer<float>::Buffer(pBVar8,(vector<float,_std::allocator<float>_> *)local_2b8);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
            (&local_478,(BufferInterface *)pBVar8);
  std::
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  ::push_back((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               *)((long)&spec1.entryPoint.field_2 + 8),&local_478);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr(&local_478);
  pBVar8 = (Buffer<float> *)operator_new(0x20);
  Buffer<float>::Buffer(pBVar8,(vector<float,_std::allocator<float>_> *)local_2d8);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
            (&local_488,(BufferInterface *)pBVar8);
  std::
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  ::push_back((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               *)&spec1.inputs.
                  super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_488);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr(&local_488);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&local_494,100,1,1);
  spec1.numWorkGroups.m_data[0] = local_48c;
  spec1.outputs.
  super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_494;
  pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pSVar9 = (SpvAsmComputeShaderCase *)operator_new(0x140);
  SpvAsmComputeShaderCase::SpvAsmComputeShaderCase
            (pSVar9,(TestContext *)
                    group.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"block","out-of-order and unreachable blocks for OpPhi",
             (ComputeShaderSpec *)&spec2.verifyIO,COMPUTE_TEST_USES_NONE);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar9);
  pcVar5 = getComputeAsmShaderPreamble();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_558,pcVar5,&local_559);
  std::operator+(&local_538,&local_558,
                 "OpName %main \"main\"\nOpName %id \"gl_GlobalInvocationID\"\nOpDecorate %id BuiltIn GlobalInvocationId\n"
                );
  pcVar5 = getComputeAsmInputOutputBufferTraits();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_580,pcVar5,&local_581);
  std::operator+(&local_518,&local_538,&local_580);
  pcVar5 = getComputeAsmCommonTypes();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,pcVar5,&local_5a9);
  std::operator+(&local_4f8,&local_518,&local_5a8);
  pcVar5 = getComputeAsmInputOutputBuffer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d0,pcVar5,&local_5d1);
  std::operator+(&local_4d8,&local_4f8,&local_5d0);
  std::operator+(&local_4b8,&local_4d8,
                 "%id         = OpVariable %uvec3ptr Input\n%zero       = OpConstant %i32 0\n%one        = OpConstant %i32 1\n%three      = OpConstant %i32 3\n%constf6p5  = OpConstant %f32 6.5\n%main       = OpFunction %void None %voidf\n%entry      = OpLabel\n%idval      = OpLoad %uvec3 %id\n%x          = OpCompositeExtract %u32 %idval 0\n%inloc      = OpAccessChain %f32ptr %indata %zero %x\n%outloc     = OpAccessChain %f32ptr %outdata %zero %x\n%inval      = OpLoad %f32 %inloc\n              OpBranch %phi\n%phi        = OpLabel\n%step       = OpPhi %i32 %zero  %entry %step_next  %phi\n%accum      = OpPhi %f32 %inval %entry %accum_next %phi\n%step_next  = OpIAdd %i32 %step %one\n%accum_next = OpFAdd %f32 %accum %constf6p5\n%still_loop = OpSLessThan %bool %step %three\n              OpLoopMerge %exit %phi None\n              OpBranchConditional %still_loop %phi %exit\n%exit       = OpLabel\n              OpStore %outloc %accum\n              OpReturn\n              OpFunctionEnd\n"
                );
  std::__cxx11::string::operator=((string *)&spec3.verifyIO,(string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator(&local_5a9);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_580);
  std::allocator<char>::~allocator(&local_581);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator(&local_559);
  pBVar8 = (Buffer<float> *)operator_new(0x20);
  Buffer<float>::Buffer(pBVar8,(vector<float,_std::allocator<float>_> *)local_2b8);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
            (&local_5e8,(BufferInterface *)pBVar8);
  std::
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  ::push_back((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               *)((long)&spec2.entryPoint.field_2 + 8),&local_5e8);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr(&local_5e8);
  pBVar8 = (Buffer<float> *)operator_new(0x20);
  Buffer<float>::Buffer(pBVar8,(vector<float,_std::allocator<float>_> *)local_2f8);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
            (&local_5f8,(BufferInterface *)pBVar8);
  std::
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  ::push_back((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               *)&spec2.inputs.
                  super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_5f8);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr(&local_5f8);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&local_604,100,1,1);
  spec2.numWorkGroups.m_data[0] = local_5fc;
  spec2.outputs.
  super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_604;
  pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pSVar9 = (SpvAsmComputeShaderCase *)operator_new(0x140);
  SpvAsmComputeShaderCase::SpvAsmComputeShaderCase
            (pSVar9,(TestContext *)
                    group.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"induction",
             "The usual way induction variables are handled in LLVM IR",
             (ComputeShaderSpec *)&spec3.verifyIO,COMPUTE_TEST_USES_NONE);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar9);
  pcVar5 = getComputeAsmShaderPreamble();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c8,pcVar5,&local_6c9);
  std::operator+(&local_6a8,&local_6c8,
                 "OpName %main \"main\"\nOpName %id \"gl_GlobalInvocationID\"\nOpDecorate %id BuiltIn GlobalInvocationId\n"
                );
  pcVar5 = getComputeAsmInputOutputBufferTraits();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f0,pcVar5,&local_6f1);
  std::operator+(&local_688,&local_6a8,&local_6f0);
  pcVar5 = getComputeAsmCommonTypes();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_718,pcVar5,&local_719);
  std::operator+(&local_668,&local_688,&local_718);
  pcVar5 = getComputeAsmInputOutputBuffer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_740,pcVar5,&local_741);
  std::operator+(&local_648,&local_668,&local_740);
  std::operator+(&local_628,&local_648,
                 "%f32ptr_f   = OpTypePointer Function %f32\n%id         = OpVariable %uvec3ptr Input\n%true       = OpConstantTrue %bool\n%false      = OpConstantFalse %bool\n%zero       = OpConstant %i32 0\n%constf8p5  = OpConstant %f32 8.5\n%main       = OpFunction %void None %voidf\n%entry      = OpLabel\n%b          = OpVariable %f32ptr_f Function %constf8p5\n%idval      = OpLoad %uvec3 %id\n%x          = OpCompositeExtract %u32 %idval 0\n%inloc      = OpAccessChain %f32ptr %indata %zero %x\n%outloc     = OpAccessChain %f32ptr %outdata %zero %x\n%a_init     = OpLoad %f32 %inloc\n%b_init     = OpLoad %f32 %b\n              OpBranch %phi\n%phi        = OpLabel\n%still_loop = OpPhi %bool %true   %entry %false  %phi\n%a_next     = OpPhi %f32  %a_init %entry %b_next %phi\n%b_next     = OpPhi %f32  %b_init %entry %a_next %phi\n              OpLoopMerge %exit %phi None\n              OpBranchConditional %still_loop %phi %exit\n%exit       = OpLabel\n%sub        = OpFSub %f32 %a_next %b_next\n              OpStore %outloc %sub\n              OpReturn\n              OpFunctionEnd\n"
                );
  std::__cxx11::string::operator=((string *)&rnd.m_rnd.z,(string *)&local_628);
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_648);
  std::__cxx11::string::~string((string *)&local_740);
  std::allocator<char>::~allocator(&local_741);
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::string::~string((string *)&local_718);
  std::allocator<char>::~allocator(&local_719);
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::allocator<char>::~allocator(&local_6f1);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::allocator<char>::~allocator(&local_6c9);
  pBVar8 = (Buffer<float> *)operator_new(0x20);
  Buffer<float>::Buffer(pBVar8,(vector<float,_std::allocator<float>_> *)local_2b8);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
            (&local_758,(BufferInterface *)pBVar8);
  std::
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  ::push_back((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               *)((long)&spec3.entryPoint.field_2 + 8),&local_758);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr(&local_758);
  pBVar8 = (Buffer<float> *)operator_new(0x20);
  Buffer<float>::Buffer(pBVar8,(vector<float,_std::allocator<float>_> *)local_318);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
            (&local_768,(BufferInterface *)pBVar8);
  std::
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  ::push_back((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               *)&spec3.inputs.
                  super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_768);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr(&local_768);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&local_774,100,1,1);
  spec3.numWorkGroups.m_data[0] = local_76c;
  spec3.outputs.
  super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_774;
  pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pSVar9 = (SpvAsmComputeShaderCase *)operator_new(0x140);
  SpvAsmComputeShaderCase::SpvAsmComputeShaderCase
            (pSVar9,(TestContext *)
                    group.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"swap","Swap the values of two variables using OpPhi",
             (ComputeShaderSpec *)&rnd.m_rnd.z,COMPUTE_TEST_USES_NONE);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar9);
  pTVar3 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_318);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_2f8);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_2d8);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_2b8);
  de::Random::~Random((Random *)local_298);
  ComputeShaderSpec::~ComputeShaderSpec((ComputeShaderSpec *)&rnd.m_rnd.z);
  ComputeShaderSpec::~ComputeShaderSpec((ComputeShaderSpec *)&spec3.verifyIO);
  ComputeShaderSpec::~ComputeShaderSpec((ComputeShaderSpec *)&spec2.verifyIO);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar3;
}

Assistant:

tcu::TestCaseGroup* createOpPhiGroup (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	group			(new tcu::TestCaseGroup(testCtx, "opphi", "Test the OpPhi instruction"));
	ComputeShaderSpec				spec1;
	ComputeShaderSpec				spec2;
	ComputeShaderSpec				spec3;
	de::Random						rnd				(deStringHash(group->getName()));
	const int						numElements		= 100;
	vector<float>					inputFloats		(numElements, 0);
	vector<float>					outputFloats1	(numElements, 0);
	vector<float>					outputFloats2	(numElements, 0);
	vector<float>					outputFloats3	(numElements, 0);

	fillRandomScalars(rnd, -300.f, 300.f, &inputFloats[0], numElements);

	// CPU might not use the same rounding mode as the GPU. Use whole numbers to avoid rounding differences.
	floorAll(inputFloats);

	for (size_t ndx = 0; ndx < numElements; ++ndx)
	{
		switch (ndx % 3)
		{
			case 0:		outputFloats1[ndx] = inputFloats[ndx] + 5.5f;	break;
			case 1:		outputFloats1[ndx] = inputFloats[ndx] + 20.5f;	break;
			case 2:		outputFloats1[ndx] = inputFloats[ndx] + 1.75f;	break;
			default:	break;
		}
		outputFloats2[ndx] = inputFloats[ndx] + 6.5f * 3;
		outputFloats3[ndx] = 8.5f - inputFloats[ndx];
	}

	spec1.assembly =
		string(getComputeAsmShaderPreamble()) +

		"OpSource GLSL 430\n"
		"OpName %main \"main\"\n"
		"OpName %id \"gl_GlobalInvocationID\"\n"

		"OpDecorate %id BuiltIn GlobalInvocationId\n"

		+ string(getComputeAsmInputOutputBufferTraits()) + string(getComputeAsmCommonTypes()) + string(getComputeAsmInputOutputBuffer()) +

		"%id = OpVariable %uvec3ptr Input\n"
		"%zero       = OpConstant %i32 0\n"
		"%three      = OpConstant %u32 3\n"
		"%constf5p5  = OpConstant %f32 5.5\n"
		"%constf20p5 = OpConstant %f32 20.5\n"
		"%constf1p75 = OpConstant %f32 1.75\n"
		"%constf8p5  = OpConstant %f32 8.5\n"
		"%constf6p5  = OpConstant %f32 6.5\n"

		"%main     = OpFunction %void None %voidf\n"
		"%entry    = OpLabel\n"
		"%idval    = OpLoad %uvec3 %id\n"
		"%x        = OpCompositeExtract %u32 %idval 0\n"
		"%selector = OpUMod %u32 %x %three\n"
		"            OpSelectionMerge %phi None\n"
		"            OpSwitch %selector %default 0 %case0 1 %case1 2 %case2\n"

		// Case 1 before OpPhi.
		"%case1    = OpLabel\n"
		"            OpBranch %phi\n"

		"%default  = OpLabel\n"
		"            OpUnreachable\n"

		"%phi      = OpLabel\n"
		"%operand  = OpPhi %f32   %constf1p75 %case2   %constf20p5 %case1   %constf5p5 %case0\n" // not in the order of blocks
		"%inloc    = OpAccessChain %f32ptr %indata %zero %x\n"
		"%inval    = OpLoad %f32 %inloc\n"
		"%add      = OpFAdd %f32 %inval %operand\n"
		"%outloc   = OpAccessChain %f32ptr %outdata %zero %x\n"
		"            OpStore %outloc %add\n"
		"            OpReturn\n"

		// Case 0 after OpPhi.
		"%case0    = OpLabel\n"
		"            OpBranch %phi\n"


		// Case 2 after OpPhi.
		"%case2    = OpLabel\n"
		"            OpBranch %phi\n"

		"            OpFunctionEnd\n";
	spec1.inputs.push_back(BufferSp(new Float32Buffer(inputFloats)));
	spec1.outputs.push_back(BufferSp(new Float32Buffer(outputFloats1)));
	spec1.numWorkGroups = IVec3(numElements, 1, 1);

	group->addChild(new SpvAsmComputeShaderCase(testCtx, "block", "out-of-order and unreachable blocks for OpPhi", spec1));

	spec2.assembly =
		string(getComputeAsmShaderPreamble()) +

		"OpName %main \"main\"\n"
		"OpName %id \"gl_GlobalInvocationID\"\n"

		"OpDecorate %id BuiltIn GlobalInvocationId\n"

		+ string(getComputeAsmInputOutputBufferTraits()) + string(getComputeAsmCommonTypes()) + string(getComputeAsmInputOutputBuffer()) +

		"%id         = OpVariable %uvec3ptr Input\n"
		"%zero       = OpConstant %i32 0\n"
		"%one        = OpConstant %i32 1\n"
		"%three      = OpConstant %i32 3\n"
		"%constf6p5  = OpConstant %f32 6.5\n"

		"%main       = OpFunction %void None %voidf\n"
		"%entry      = OpLabel\n"
		"%idval      = OpLoad %uvec3 %id\n"
		"%x          = OpCompositeExtract %u32 %idval 0\n"
		"%inloc      = OpAccessChain %f32ptr %indata %zero %x\n"
		"%outloc     = OpAccessChain %f32ptr %outdata %zero %x\n"
		"%inval      = OpLoad %f32 %inloc\n"
		"              OpBranch %phi\n"

		"%phi        = OpLabel\n"
		"%step       = OpPhi %i32 %zero  %entry %step_next  %phi\n"
		"%accum      = OpPhi %f32 %inval %entry %accum_next %phi\n"
		"%step_next  = OpIAdd %i32 %step %one\n"
		"%accum_next = OpFAdd %f32 %accum %constf6p5\n"
		"%still_loop = OpSLessThan %bool %step %three\n"
		"              OpLoopMerge %exit %phi None\n"
		"              OpBranchConditional %still_loop %phi %exit\n"

		"%exit       = OpLabel\n"
		"              OpStore %outloc %accum\n"
		"              OpReturn\n"
		"              OpFunctionEnd\n";
	spec2.inputs.push_back(BufferSp(new Float32Buffer(inputFloats)));
	spec2.outputs.push_back(BufferSp(new Float32Buffer(outputFloats2)));
	spec2.numWorkGroups = IVec3(numElements, 1, 1);

	group->addChild(new SpvAsmComputeShaderCase(testCtx, "induction", "The usual way induction variables are handled in LLVM IR", spec2));

	spec3.assembly =
		string(getComputeAsmShaderPreamble()) +

		"OpName %main \"main\"\n"
		"OpName %id \"gl_GlobalInvocationID\"\n"

		"OpDecorate %id BuiltIn GlobalInvocationId\n"

		+ string(getComputeAsmInputOutputBufferTraits()) + string(getComputeAsmCommonTypes()) + string(getComputeAsmInputOutputBuffer()) +

		"%f32ptr_f   = OpTypePointer Function %f32\n"
		"%id         = OpVariable %uvec3ptr Input\n"
		"%true       = OpConstantTrue %bool\n"
		"%false      = OpConstantFalse %bool\n"
		"%zero       = OpConstant %i32 0\n"
		"%constf8p5  = OpConstant %f32 8.5\n"

		"%main       = OpFunction %void None %voidf\n"
		"%entry      = OpLabel\n"
		"%b          = OpVariable %f32ptr_f Function %constf8p5\n"
		"%idval      = OpLoad %uvec3 %id\n"
		"%x          = OpCompositeExtract %u32 %idval 0\n"
		"%inloc      = OpAccessChain %f32ptr %indata %zero %x\n"
		"%outloc     = OpAccessChain %f32ptr %outdata %zero %x\n"
		"%a_init     = OpLoad %f32 %inloc\n"
		"%b_init     = OpLoad %f32 %b\n"
		"              OpBranch %phi\n"

		"%phi        = OpLabel\n"
		"%still_loop = OpPhi %bool %true   %entry %false  %phi\n"
		"%a_next     = OpPhi %f32  %a_init %entry %b_next %phi\n"
		"%b_next     = OpPhi %f32  %b_init %entry %a_next %phi\n"
		"              OpLoopMerge %exit %phi None\n"
		"              OpBranchConditional %still_loop %phi %exit\n"

		"%exit       = OpLabel\n"
		"%sub        = OpFSub %f32 %a_next %b_next\n"
		"              OpStore %outloc %sub\n"
		"              OpReturn\n"
		"              OpFunctionEnd\n";
	spec3.inputs.push_back(BufferSp(new Float32Buffer(inputFloats)));
	spec3.outputs.push_back(BufferSp(new Float32Buffer(outputFloats3)));
	spec3.numWorkGroups = IVec3(numElements, 1, 1);

	group->addChild(new SpvAsmComputeShaderCase(testCtx, "swap", "Swap the values of two variables using OpPhi", spec3));

	return group.release();
}